

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringbuilder.h
# Opt level: O3

QString * operator+=(QString *a,QStringBuilder<QStringView,_const_char16_t_&> *b)

{
  ArrayOptions *pAVar1;
  char16_t *__dest;
  long lVar2;
  Data *pDVar3;
  char16_t *pcVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  qsizetype n;
  long alloc;
  
  pDVar3 = (a->d).d;
  lVar5 = (a->d).size;
  alloc = lVar5 + (b->a).m_size + 1;
  if ((pDVar3 == (Data *)0x0) ||
     (1 < (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
    QString::reallocData(a,lVar5,KeepSize);
    pDVar3 = (a->d).d;
    if (pDVar3 != (Data *)0x0) goto LAB_00169740;
    if (0 < alloc) {
      lVar5 = (a->d).size;
      goto LAB_00169795;
    }
  }
  else {
LAB_00169740:
    lVar6 = (pDVar3->super_QArrayData).alloc;
    lVar5 = (a->d).size;
    lVar7 = (long)((long)(a->d).ptr -
                  ((ulong)((long)&pDVar3[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)) >> 1
    ;
    if ((lVar6 - lVar5) - lVar7 < alloc) {
      lVar2 = lVar6 * 2;
      if (lVar6 * 2 < alloc) {
        lVar2 = alloc;
      }
      alloc = lVar2;
      if ((1 < (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i) ||
         (lVar6 - lVar7 <= alloc)) {
LAB_00169795:
        if (alloc < lVar5) {
          alloc = lVar5;
        }
        QString::reallocData(a,alloc,KeepSize);
        pDVar3 = (a->d).d;
        if (pDVar3 == (Data *)0x0) goto LAB_001697c5;
        lVar6 = (pDVar3->super_QArrayData).alloc;
      }
      if (lVar6 != 0) {
        pAVar1 = &(pDVar3->super_QArrayData).flags;
        *(byte *)&(pAVar1->super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>).
                  super_QFlagsStorage<QArrayData::ArrayOption>.i =
             (byte)(pAVar1->super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>).
                   super_QFlagsStorage<QArrayData::ArrayOption>.i | 1;
      }
    }
    if ((pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i < 2)
    goto LAB_001697d6;
  }
LAB_001697c5:
  QString::reallocData(a,(a->d).size,KeepSize);
LAB_001697d6:
  pcVar4 = (a->d).ptr;
  __dest = pcVar4 + (a->d).size;
  lVar5 = (b->a).m_size;
  if (lVar5 != 0) {
    memcpy(__dest,(b->a).m_data,lVar5 * 2);
    pcVar4 = (a->d).ptr;
  }
  __dest[lVar5] = *b->b;
  if (pcVar4 == (char16_t *)0x0) {
    pcVar4 = L"";
  }
  QString::resize(a,(long)(__dest + lVar5) + (2 - (long)pcVar4) >> 1);
  return a;
}

Assistant:

QString &operator+=(QString &a, const QStringBuilder<A, B> &b)
{
    qsizetype len = a.size() + QConcatenable< QStringBuilder<A, B> >::size(b);
    a.detach(); // a detach() in a.data() could reset a.capacity() to a.size()
    if (len > a.data_ptr().freeSpaceAtEnd()) // capacity() was broken when prepend()-optimization landed
        a.reserve(qMax(len, 2 * a.capacity()));
    QChar *it = a.data() + a.size();
    QConcatenable< QStringBuilder<A, B> >::appendTo(b, it);
    // we need to resize after the appendTo for the case str+=foo+str
    a.resize(it - a.constData()); //may be smaller than len if there was conversion from utf8
    return a;
}